

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

Cookie * Curl_cookie_getlist(CookieInfo *c,char *host,char *path,_Bool secure)

{
  size_t sVar1;
  _Bool _Var2;
  _Bool _Var3;
  int iVar4;
  time_t tVar5;
  size_t *psVar6;
  ulong local_70;
  size_t i;
  Cookie **array;
  size_t sStack_58;
  _Bool is_ip;
  size_t matches;
  Cookie *mainco;
  time_t now;
  Cookie *co;
  Cookie *newco;
  _Bool secure_local;
  char *path_local;
  char *host_local;
  CookieInfo *c_local;
  
  tVar5 = time((time_t *)0x0);
  matches = 0;
  sStack_58 = 0;
  if ((c == (CookieInfo *)0x0) || (c->cookies == (Cookie *)0x0)) {
    c_local = (CookieInfo *)0x0;
  }
  else {
    remove_expired(c);
    _Var2 = isip(host);
    for (now = (time_t)c->cookies; now != 0; now = *(time_t *)now) {
      if (((((*(long *)(now + 0x30) == 0) || (tVar5 < *(long *)(now + 0x30))) &&
           (((*(byte *)(now + 0x58) & 1) == 0 || (secure)))) &&
          (((*(long *)(now + 0x28) == 0 ||
            ((((*(byte *)(now + 0x40) & 1) != 0 && (!_Var2)) &&
             (_Var3 = tailmatch(*(char **)(now + 0x28),host), _Var3)))) ||
           ((((*(byte *)(now + 0x40) & 1) == 0 || (_Var2)) &&
            (iVar4 = Curl_raw_equal(host,*(char **)(now + 0x28)), iVar4 != 0)))))) &&
         ((*(long *)(now + 0x20) == 0 || (_Var3 = pathmatch(*(char **)(now + 0x20),path), _Var3))))
      {
        psVar6 = (size_t *)(*Curl_cmalloc)(0x60);
        if (psVar6 == (size_t *)0x0) goto LAB_008f1a13;
        memcpy(psVar6,(void *)now,0x60);
        *psVar6 = matches;
        sStack_58 = sStack_58 + 1;
        matches = (size_t)psVar6;
      }
    }
    if (sStack_58 != 0) {
      psVar6 = (size_t *)(*Curl_cmalloc)(sStack_58 << 3);
      if (psVar6 == (size_t *)0x0) {
LAB_008f1a13:
        while (matches != 0) {
          sVar1 = *(size_t *)matches;
          (*Curl_cfree)((void *)matches);
          matches = sVar1;
        }
        return (Cookie *)0x0;
      }
      local_70 = 0;
      for (now = matches; now != 0; now = *(time_t *)now) {
        psVar6[local_70] = now;
        local_70 = local_70 + 1;
      }
      qsort(psVar6,sStack_58,8,cookie_sort);
      matches = *psVar6;
      for (local_70 = 0; local_70 < sStack_58 - 1; local_70 = local_70 + 1) {
        *(size_t *)psVar6[local_70] = psVar6[local_70 + 1];
      }
      *(undefined8 *)psVar6[sStack_58 - 1] = 0;
      (*Curl_cfree)(psVar6);
    }
    c_local = (CookieInfo *)matches;
  }
  return (Cookie *)c_local;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  time_t now = time(NULL);
  struct Cookie *mainco=NULL;
  size_t matches = 0;
  bool is_ip;

  if(!c || !c->cookies)
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = isip(host);

  co = c->cookies;

  while(co) {
    /* only process this cookie if it is not expired or had no expire
       date AND that if the cookie requires we're secure we must only
       continue if we are! */
    if((!co->expires || (co->expires > now)) &&
       (co->secure?secure:TRUE)) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && Curl_raw_equal(host, co->domain)) ) {
        /* the right part of the host matches the domain stuff in the
           cookie data */

        /* now check the left part of the path with the cookies path
           requirement */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /* and now, we know this is a match and we should create an
             entry for the return-linked-list */

          newco = malloc(sizeof(struct Cookie));
          if(newco) {
            /* first, copy the whole source cookie: */
            memcpy(newco, co, sizeof(struct Cookie));

            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
          }
          else {
            fail:
            /* failure, clear up the allocated chain and return NULL */
            while(mainco) {
              co = mainco->next;
              free(mainco);
              mainco = co;
            }

            return NULL;
          }
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /* Now we need to make sure that if there is a name appearing more than
       once, the longest specified path version comes first. To make this
       the swiftest way, we just sort them all based on path length. */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i=0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i=0; i<matches-1; i++)
      array[i]->next = array[i+1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */
}